

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int lyxp_atomize(char *expr,lys_node *cur_snode,lyxp_node_type cur_snode_type,lyxp_set *set,
                int options,lys_node **ctx_snode)

{
  lys_node *plVar1;
  lyxp_node_type lVar2;
  int iVar3;
  lyxp_expr *exp;
  lys_module *plVar4;
  uint uVar5;
  lys_node *local_40;
  lys_node *_ctx_snode;
  lyxp_node_type ctx_snode_type;
  uint16_t exp_idx;
  
  _ctx_snode._6_2_ = 0;
  exp = lyxp_parse_expr(cur_snode->module->ctx,expr);
  if (exp == (lyxp_expr *)0x0) {
    iVar3 = -1;
  }
  else {
    iVar3 = reparse_or_expr(cur_snode->module->ctx,exp,(uint16_t *)((long)&_ctx_snode + 6));
    if (iVar3 == 0) {
      if (_ctx_snode._6_2_ < exp->used) {
        uVar5 = (uint)_ctx_snode._6_2_;
        ly_vlog(cur_snode->module->ctx,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,"Unknown",
                exp->expr + *(ushort *)((long)exp->expr_pos + (ulong)(uVar5 * 2)));
        iVar3 = -1;
        ly_vlog(cur_snode->module->ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                "Unparsed characters \"%s\" left at the end of an XPath expression.",
                exp->expr + *(ushort *)((long)exp->expr_pos + (ulong)(uVar5 * 2)));
      }
      else {
        print_expr_struct_debug(exp);
        plVar1 = cur_snode;
        lVar2 = cur_snode_type;
        if ((options & 0x10U) != 0) {
          resolve_when_ctx_snode(cur_snode,&local_40,(lyxp_node_type *)&_ctx_snode);
          plVar1 = local_40;
          lVar2 = (lyxp_node_type)_ctx_snode;
        }
        _ctx_snode._0_4_ = lVar2;
        local_40 = plVar1;
        if (ctx_snode != (lys_node **)0x0) {
          *ctx_snode = local_40;
        }
        _ctx_snode._6_2_ = 0;
        *(undefined8 *)set = 0;
        *(undefined8 *)&set->field_0x8 = 0;
        set->ctx_pos = 0;
        set->ctx_size = 0;
        *(undefined8 *)&set->field_0x38 = 0;
        set->used = 0;
        set->size = 0;
        set->ht = (hash_table *)0x0;
        (set->val).nodes = (lyxp_set_node *)0x0;
        *(undefined8 *)((long)&set->val + 8) = 0;
        set->type = LYXP_SET_SNODE_SET;
        set_snode_insert_node(set,local_40,(lyxp_node_type)_ctx_snode);
        plVar1 = local_40;
        plVar4 = lys_node_module(local_40);
        iVar3 = eval_expr_select(exp,(uint16_t *)((long)&_ctx_snode + 6),LYXP_EXPR_NONE,
                                 (lyd_node *)plVar1,plVar4,set,options);
        if (iVar3 == 2) {
          iVar3 = 0;
        }
      }
    }
  }
  lyxp_expr_free(exp);
  return iVar3;
}

Assistant:

int
lyxp_atomize(const char *expr, const struct lys_node *cur_snode, enum lyxp_node_type cur_snode_type,
             struct lyxp_set *set, int options, const struct lys_node **ctx_snode)
{
    struct lys_node *_ctx_snode;
    enum lyxp_node_type ctx_snode_type;
    struct lyxp_expr *exp;
    uint16_t exp_idx = 0;
    int rc = -1;

    exp = lyxp_parse_expr(cur_snode->module->ctx, expr);
    if (!exp) {
        rc = -1;
        goto finish;
    }

    rc = reparse_or_expr(cur_snode->module->ctx, exp, &exp_idx);
    if (rc) {
        goto finish;
    } else if (exp->used > exp_idx) {
        LOGVAL(cur_snode->module->ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, "Unknown", &exp->expr[exp->expr_pos[exp_idx]]);
        LOGVAL(cur_snode->module->ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Unparsed characters \"%s\" left at the end of an XPath expression.",
               &exp->expr[exp->expr_pos[exp_idx]]);
        rc = -1;
        goto finish;
    }

    print_expr_struct_debug(exp);

    if (options & LYXP_SNODE_WHEN) {
        /* for when the context node may need to be changed */
        resolve_when_ctx_snode(cur_snode, &_ctx_snode, &ctx_snode_type);
    } else {
        _ctx_snode = (struct lys_node *)cur_snode;
        ctx_snode_type = cur_snode_type;
    }

    if (ctx_snode) {
        *ctx_snode = _ctx_snode;
    }

    exp_idx = 0;
    memset(set, 0, sizeof *set);
    set->type = LYXP_SET_SNODE_SET;
    set_snode_insert_node(set, _ctx_snode, ctx_snode_type);

    rc = eval_expr_select(exp, &exp_idx, 0, (struct lyd_node *)_ctx_snode, lys_node_module(_ctx_snode), set, options);
    if (rc == 2) {
        rc = EXIT_SUCCESS;
    }

finish:
    lyxp_expr_free(exp);
    return rc;
}